

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

Option<Catch::SectionTracking::TestCaseTracker> * __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::operator=
          (Option<Catch::SectionTracking::TestCaseTracker> *this,TestCaseTracker *_value)

{
  reset(this);
  SectionTracking::TestCaseTracker::TestCaseTracker((TestCaseTracker *)this->storage,_value);
  this->nullableValue = (TestCaseTracker *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }